

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

BroadcastInfo * parseBroadcastInfo(string *message)

{
  size_t sVar1;
  BroadcastInfo *in_RDI;
  uint8_t *p;
  BroadcastInfo *result;
  string local_b0 [32];
  string local_90 [28];
  int in_stack_ffffffffffffff8c;
  string local_70 [48];
  string local_40 [32];
  byte *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  BroadcastInfo::BroadcastInfo((BroadcastInfo *)0x1767a1);
  local_20 = (byte *)std::__cxx11::string::data();
  sVar1 = strlen(kFileBroadcastPrefix);
  local_20 = (byte *)((long)local_20 + sVar1 + 1);
  std::__cxx11::to_string(in_stack_ffffffffffffff8c);
  std::__cxx11::string::operator+=((string *)in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::operator+=((string *)in_RDI,'.');
  local_20 = (byte *)((long)local_20 + 1);
  std::__cxx11::to_string(in_stack_ffffffffffffff8c);
  std::__cxx11::string::operator+=((string *)in_RDI,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::operator+=((string *)in_RDI,'.');
  local_20 = (byte *)((long)local_20 + 1);
  std::__cxx11::to_string(in_stack_ffffffffffffff8c);
  std::__cxx11::string::operator+=((string *)in_RDI,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::operator+=((string *)in_RDI,'.');
  local_20 = (byte *)((long)local_20 + 1);
  std::__cxx11::to_string(in_stack_ffffffffffffff8c);
  std::__cxx11::string::operator+=((string *)in_RDI,local_b0);
  std::__cxx11::string::~string(local_b0);
  in_RDI->port = (uint)*local_20 << 8;
  in_RDI->port = (uint)local_20[1] + in_RDI->port;
  in_RDI->key = (uint)local_20[2] << 8;
  in_RDI->key = (uint)local_20[3] + in_RDI->key;
  return in_RDI;
}

Assistant:

BroadcastInfo parseBroadcastInfo(const std::string & message) {
    BroadcastInfo result;

    const uint8_t *p = (uint8_t *) message.data();
    p += strlen(kFileBroadcastPrefix);

    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));

    result.port  = 256*((int)(*p++));
    result.port +=     ((int)(*p++));

    result.key  = 256*((int)(*p++));
    result.key +=     ((int)(*p++));

    return result;
}